

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar1;
  pointer pbVar2;
  DescriptorPool *pDVar3;
  OptionsToInterpret *__last;
  Message *pMVar4;
  MessageLite *this_00;
  OptionsToInterpret *__first;
  __type _Var5;
  bool bVar6;
  byte bVar7;
  int32 iVar8;
  int iVar9;
  FileDescriptor *pFVar10;
  Type *pTVar11;
  SourceCodeInfo *this_01;
  FileDescriptorTables *pFVar12;
  string *psVar13;
  FileDescriptor **ppFVar14;
  DescriptorPool *pDVar15;
  int *piVar16;
  Type *proto_00;
  Type *proto_01;
  Type *proto_02;
  Type *proto_03;
  undefined4 extraout_var;
  FieldDescriptor *pFVar17;
  LogMessage *pLVar18;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Message *f;
  void *dummy;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_00;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_01;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *paVar19;
  int i_2;
  int i;
  int iVar20;
  SourceCodeInfo *from;
  FileOptions *orig_options;
  Tables *pTVar21;
  int i_4;
  long lVar22;
  OptionsToInterpret *pOVar23;
  ulong uVar24;
  long lVar25;
  int i_1;
  int iVar26;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar27;
  FileDescriptor *local_1a0;
  LogFinisher local_191;
  string buf;
  LogMessage local_170;
  OptionsToInterpret *local_138;
  FileDescriptorProto existing_proto;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  pFVar10 = DescriptorPool::Tables::FindFile(this->tables_,&this->filename_);
  if (pFVar10 != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto(&existing_proto);
    FileDescriptor::CopyTo(pFVar10,&existing_proto);
    MessageLite::SerializeAsString_abi_cxx11_((string *)&local_170,(MessageLite *)&existing_proto);
    MessageLite::SerializeAsString_abi_cxx11_((string *)&seen_dependencies,(MessageLite *)proto);
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_170,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &seen_dependencies);
    std::__cxx11::string::~string((string *)&seen_dependencies);
    std::__cxx11::string::~string((string *)&local_170);
    FileDescriptorProto::~FileDescriptorProto(&existing_proto);
    if (_Var5) {
      return pFVar10;
    }
  }
  lVar22 = 0;
  uVar24 = 0;
  while( true ) {
    pTVar21 = this->tables_;
    pbVar2 = (pTVar21->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pTVar21->pending_files_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar24)
    break;
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar2->_M_dataplus)._M_p + lVar22),proto->name_);
    if (_Var5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&existing_proto,"File recursively imports itself: ",
                 (allocator<char> *)&local_170);
      for (; uVar24 < (ulong)((long)(this->tables_->pending_files_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->tables_->pending_files_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar24 = uVar24 + 1) {
        std::__cxx11::string::append((string *)&existing_proto);
        std::__cxx11::string::append((char *)&existing_proto);
      }
      std::__cxx11::string::append((string *)&existing_proto);
      AddError(this,proto->name_,&proto->super_Message,OTHER,(string *)&existing_proto);
      std::__cxx11::string::~string((string *)&existing_proto);
      goto LAB_001e1b93;
    }
    uVar24 = uVar24 + 1;
    lVar22 = lVar22 + 0x20;
  }
  if (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pTVar21->pending_files_,proto->name_);
    pRVar1 = &proto->dependency_;
    for (iVar20 = 0; pTVar21 = this->tables_,
        iVar20 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_; iVar20 = iVar20 + 1)
    {
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
      pFVar10 = DescriptorPool::Tables::FindFile(pTVar21,pTVar11);
      if (pFVar10 == (FileDescriptor *)0x0) {
        pDVar15 = this->pool_;
        pDVar3 = pDVar15->underlay_;
        if (pDVar3 != (DescriptorPool *)0x0) {
          pTVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
          pFVar10 = DescriptorPool::FindFileByName(pDVar3,pTVar11);
          if (pFVar10 != (FileDescriptor *)0x0) goto LAB_001e167f;
          pDVar15 = this->pool_;
        }
        pTVar11 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
        DescriptorPool::TryFindFileInFallbackDatabase(pDVar15,pTVar11);
      }
LAB_001e167f:
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&pTVar21->pending_files_);
    pTVar21 = this->tables_;
  }
  DescriptorPool::Tables::AddCheckpoint(pTVar21);
  local_1a0 = DescriptorPool::Tables::Allocate<google::protobuf::FileDescriptor>(this->tables_);
  this->file_ = local_1a0;
  if ((proto->_has_bits_[0] & 0x400) == 0) {
    this_01 = SourceCodeInfo::default_instance();
  }
  else {
    this_01 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                        (this->tables_,(SourceCodeInfo *)0x0);
    from = proto->source_code_info_;
    if (from == (SourceCodeInfo *)0x0) {
      from = *(SourceCodeInfo **)(FileDescriptorProto::default_instance_ + 0xc0);
    }
    SourceCodeInfo::CopyFrom(this_01,from);
  }
  *(SourceCodeInfo **)(local_1a0 + 0x98) = this_01;
  pFVar12 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
  this->file_tables_ = pFVar12;
  *(FileDescriptorTables **)(this->file_ + 0x90) = pFVar12;
  if ((proto->_has_bits_[0] & 1) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&existing_proto,"",(allocator<char> *)&seen_dependencies);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"Missing field: FileDescriptorProto.name.",
               (allocator<char> *)&buf);
    AddError(this,(string *)&existing_proto,&proto->super_Message,OTHER,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&existing_proto);
  }
  psVar13 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
  *(string **)local_1a0 = psVar13;
  pTVar21 = this->tables_;
  if ((proto->_has_bits_[0] & 2) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&existing_proto,"",(allocator<char> *)&local_170);
    psVar13 = DescriptorPool::Tables::AllocateString(pTVar21,(string *)&existing_proto);
    *(string **)(local_1a0 + 8) = psVar13;
    std::__cxx11::string::~string((string *)&existing_proto);
  }
  else {
    psVar13 = DescriptorPool::Tables::AllocateString(pTVar21,proto->package_);
    *(string **)(local_1a0 + 8) = psVar13;
  }
  *(DescriptorPool **)(local_1a0 + 0x10) = this->pool_;
  bVar6 = DescriptorPool::Tables::AddFile(this->tables_,local_1a0);
  if (bVar6) {
    if ((*(string **)(local_1a0 + 8))->_M_string_length != 0) {
      AddPackage(this,*(string **)(local_1a0 + 8),&proto->super_Message,local_1a0);
    }
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar20 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_1a0 + 0x18) = iVar20;
    seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         seen_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ppFVar14 = DescriptorPool::Tables::AllocateArray<google::protobuf::FileDescriptor_const*>
                         (this->tables_,iVar20);
    *(FileDescriptor ***)(local_1a0 + 0x20) = ppFVar14;
    pRVar1 = &proto->dependency_;
    for (lVar22 = 0; iVar20 = (int)lVar22,
        lVar22 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_; lVar22 = lVar22 + 1)
    {
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
      pVar27 = std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&seen_dependencies,pTVar11);
      if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        psVar13 = proto->name_;
        pTVar11 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_170,"Import \"",pTVar11);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &existing_proto,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_170,"\" was listed twice.");
        AddError(this,psVar13,&proto->super_Message,OTHER,(string *)&existing_proto);
        std::__cxx11::string::~string((string *)&existing_proto);
        std::__cxx11::string::~string((string *)&local_170);
      }
      pTVar21 = this->tables_;
      pTVar11 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
      pFVar10 = DescriptorPool::Tables::FindFile(pTVar21,pTVar11);
      if (pFVar10 == (FileDescriptor *)0x0) {
        pDVar15 = this->pool_;
        pDVar3 = pDVar15->underlay_;
        if (pDVar3 != (DescriptorPool *)0x0) {
          pTVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
          pFVar10 = DescriptorPool::FindFileByName(pDVar3,pTVar11);
          if (pFVar10 != (FileDescriptor *)0x0) goto LAB_001e19f9;
          pDVar15 = this->pool_;
        }
        if (pDVar15->allow_unknown_ == true) {
          pTVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
          pFVar10 = NewPlaceholderFile(this,pTVar11);
        }
        else {
          existing_proto.super_Message.super_MessageLite._vptr_MessageLite =
               (MessageLite)&existing_proto.name_;
          existing_proto._unknown_fields_.fields_ =
               (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)0x0;
          existing_proto.name_ = (string *)((ulong)existing_proto.name_ & 0xffffffffffffff00);
          if (pDVar15->fallback_database_ == (DescriptorDatabase *)0x0) {
            pTVar11 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
            std::operator+(&buf,"Import \"",pTVar11);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_170,&buf,"\" has not been loaded.");
          }
          else {
            pTVar11 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&pRVar1->super_RepeatedPtrFieldBase,iVar20);
            std::operator+(&buf,"Import \"",pTVar11);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_170,&buf,"\" was not found or had errors.");
          }
          std::__cxx11::string::operator=((string *)&existing_proto,(string *)&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&buf);
          AddError(this,proto->name_,&proto->super_Message,OTHER,(string *)&existing_proto);
          std::__cxx11::string::~string((string *)&existing_proto);
          pFVar10 = (FileDescriptor *)0x0;
        }
      }
LAB_001e19f9:
      *(FileDescriptor **)(*(long *)(local_1a0 + 0x20) + lVar22 * 8) = pFVar10;
    }
    piVar16 = DescriptorPool::Tables::AllocateArray<int>
                        (this->tables_,(proto->public_dependency_).current_size_);
    *(int **)(local_1a0 + 0x30) = piVar16;
    iVar20 = 0;
    for (iVar26 = 0; iVar26 < (proto->public_dependency_).current_size_; iVar26 = iVar26 + 1) {
      iVar8 = FileDescriptorProto::public_dependency(proto,iVar26);
      if ((iVar8 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar8)) {
        psVar13 = proto->name_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&existing_proto,"Invalid public dependency index.",
                   (allocator<char> *)&local_170);
        AddError(this,psVar13,&proto->super_Message,OTHER,(string *)&existing_proto);
        std::__cxx11::string::~string((string *)&existing_proto);
      }
      else {
        lVar22 = (long)iVar20;
        iVar20 = iVar20 + 1;
        *(int32 *)(*(long *)(local_1a0 + 0x30) + lVar22 * 4) = iVar8;
      }
    }
    *(int *)(local_1a0 + 0x28) = iVar20;
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::clear(&(this->dependencies_)._M_t);
    for (lVar22 = 0; lVar22 < *(int *)(local_1a0 + 0x18); lVar22 = lVar22 + 1) {
      RecordPublicDependencies(this,*(FileDescriptor **)(*(long *)(local_1a0 + 0x20) + lVar22 * 8));
    }
    piVar16 = DescriptorPool::Tables::AllocateArray<int>
                        (this->tables_,(proto->weak_dependency_).current_size_);
    *(int **)(local_1a0 + 0x40) = piVar16;
    iVar20 = 0;
    for (iVar26 = 0; iVar26 < (proto->weak_dependency_).current_size_; iVar26 = iVar26 + 1) {
      iVar8 = FileDescriptorProto::weak_dependency(proto,iVar26);
      if ((iVar8 < 0) || ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar8)) {
        psVar13 = proto->name_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&existing_proto,"Invalid weak dependency index.",
                   (allocator<char> *)&local_170);
        AddError(this,psVar13,&proto->super_Message,OTHER,(string *)&existing_proto);
        std::__cxx11::string::~string((string *)&existing_proto);
      }
      else {
        lVar22 = (long)iVar20;
        iVar20 = iVar20 + 1;
        *(int32 *)(*(long *)(local_1a0 + 0x40) + lVar22 * 4) = iVar8;
      }
    }
    *(int *)(local_1a0 + 0x38) = iVar20;
    iVar20 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_1a0 + 0x48) = iVar20;
    AllocateArray<google::protobuf::Descriptor>(this,iVar20,(Descriptor **)(local_1a0 + 0x50));
    lVar25 = 0;
    for (lVar22 = 0; lVar22 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
        lVar22 = lVar22 + 1) {
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->message_type_).super_RepeatedPtrFieldBase,(int)lVar22);
      BuildMessage(this,proto_00,(Descriptor *)0x0,*(Descriptor **)(local_1a0 + 0x50) + lVar25);
      lVar25 = lVar25 + 0x78;
    }
    iVar20 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_1a0 + 0x58) = iVar20;
    AllocateArray<google::protobuf::EnumDescriptor>
              (this,iVar20,(EnumDescriptor **)(local_1a0 + 0x60));
    lVar25 = 0;
    for (lVar22 = 0; lVar22 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        lVar22 = lVar22 + 1) {
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar22);
      BuildEnum(this,proto_01,(Descriptor *)0x0,*(EnumDescriptor **)(local_1a0 + 0x60) + lVar25);
      lVar25 = lVar25 + 0x38;
    }
    iVar20 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_1a0 + 0x68) = iVar20;
    AllocateArray<google::protobuf::ServiceDescriptor>
              (this,iVar20,(ServiceDescriptor **)(local_1a0 + 0x70));
    lVar25 = 0;
    for (lVar22 = 0; lVar22 < (proto->service_).super_RepeatedPtrFieldBase.current_size_;
        lVar22 = lVar22 + 1) {
      proto_02 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                           (&(proto->service_).super_RepeatedPtrFieldBase,(int)lVar22);
      BuildService(this,proto_02,dummy,*(ServiceDescriptor **)(local_1a0 + 0x70) + lVar25);
      lVar25 = lVar25 + 0x30;
    }
    iVar20 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
    *(int *)(local_1a0 + 0x78) = iVar20;
    AllocateArray<google::protobuf::FieldDescriptor>
              (this,iVar20,(FieldDescriptor **)(local_1a0 + 0x80));
    lVar25 = 0;
    for (lVar22 = 0; lVar22 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        lVar22 = lVar22 + 1) {
      proto_03 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar22);
      BuildExtension(this,proto_03,(Descriptor *)0x0,
                     (FieldDescriptor *)(*(long *)(local_1a0 + 0x80) + lVar25));
      lVar25 = lVar25 + 0x78;
    }
    if ((proto->_has_bits_[0] & 0x200) == 0) {
      *(undefined8 *)(local_1a0 + 0x88) = 0;
    }
    else {
      orig_options = proto->options_;
      if (orig_options == (FileOptions *)0x0) {
        orig_options = *(FileOptions **)(FileDescriptorProto::default_instance_ + 0xb8);
      }
      AllocateOptions(this,orig_options,local_1a0);
    }
    CrossLinkFile(this,local_1a0,proto);
    bVar7 = this->had_errors_;
    if ((bool)bVar7 == false) {
      OptionInterpreter::OptionInterpreter((OptionInterpreter *)&existing_proto,this);
      paVar19 = extraout_RDX;
      for (pOVar23 = (this->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          __last = (this->options_to_interpret_).
                   super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pOVar23 != __last;
          pOVar23 = pOVar23 + 1) {
        pMVar4 = pOVar23->original_options;
        this_00 = &pOVar23->options->super_MessageLite;
        existing_proto._unknown_fields_.fields_ =
             (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)pOVar23;
        iVar20 = (*this_00->_vptr_MessageLite[0x13])(this_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"uninterpreted_option",(allocator<char> *)&buf);
        pFVar17 = Descriptor::FindFieldByName
                            ((Descriptor *)CONCAT44(extraout_var,iVar20),(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        if (pFVar17 == (FieldDescriptor *)0x0) {
          internal::LogMessage::LogMessage
                    (&local_170,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                     ,0x10aa);
          pLVar18 = internal::LogMessage::operator<<
                              (&local_170,"CHECK failed: uninterpreted_options_field != NULL: ");
          pLVar18 = internal::LogMessage::operator<<
                              (pLVar18,
                               "No field named \"uninterpreted_option\" in the Options proto.");
          internal::LogFinisher::operator=((LogFinisher *)&buf,pLVar18);
          internal::LogMessage::~LogMessage(&local_170);
        }
        iVar20 = (*this_00->_vptr_MessageLite[0x12])(this_00);
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar20) + 0x38))
                  ((long *)CONCAT44(extraout_var_00,iVar20),this_00,pFVar17);
        iVar20 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0x13])(pMVar4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"uninterpreted_option",(allocator<char> *)&buf);
        pFVar17 = Descriptor::FindFieldByName
                            ((Descriptor *)CONCAT44(extraout_var_01,iVar20),(string *)&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        if (pFVar17 == (FieldDescriptor *)0x0) {
          internal::LogMessage::LogMessage
                    (&local_170,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                     ,0x10b2);
          pLVar18 = internal::LogMessage::operator<<
                              (&local_170,
                               "CHECK failed: original_uninterpreted_options_field != NULL: ");
          pLVar18 = internal::LogMessage::operator<<
                              (pLVar18,
                               "No field named \"uninterpreted_option\" in the Options proto.");
          internal::LogFinisher::operator=((LogFinisher *)&buf,pLVar18);
          internal::LogMessage::~LogMessage(&local_170);
        }
        iVar20 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0x12])(pMVar4);
        iVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar20) + 0x30))
                           ((long *)CONCAT44(extraout_var_02,iVar20),pMVar4,pFVar17);
        iVar26 = 0;
        local_138 = pOVar23;
        if (iVar20 < 1) {
          iVar20 = iVar26;
        }
        do {
          if (iVar20 == iVar26) {
            existing_proto._unknown_fields_.fields_ =
                 (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0;
            existing_proto.name_ = (string *)0x0;
            buf._M_dataplus._M_p = (pointer)&buf.field_2;
            buf._M_string_length = 0;
            buf.field_2._M_local_buf[0] = '\0';
            MessageLite::AppendToString(this_00,&buf);
            bVar6 = MessageLite::ParseFromString(this_00,&buf);
            pOVar23 = local_138;
            if (!bVar6) {
              internal::LogMessage::LogMessage
                        (&local_170,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                         ,0x10d0);
              pLVar18 = internal::LogMessage::operator<<
                                  (&local_170,"CHECK failed: options->ParseFromString(buf): ");
              pLVar18 = internal::LogMessage::operator<<
                                  (pLVar18,"Protocol message serialized itself in invalid fashion.")
              ;
              internal::LogFinisher::operator=(&local_191,pLVar18);
              internal::LogMessage::~LogMessage(&local_170);
            }
            std::__cxx11::string::~string((string *)&buf);
            paVar19 = extraout_RDX_01;
            goto LAB_001e21da;
          }
          iVar9 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0x12])(pMVar4);
          f = (Message *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar9) + 0x160))
                        ((long *)CONCAT44(extraout_var_03,iVar9),pMVar4,pFVar17,iVar26);
          existing_proto.name_ =
               (string *)
               internal::
               down_cast<google::protobuf::UninterpretedOption_const*,google::protobuf::Message_const>
                         (f);
          bVar6 = OptionInterpreter::InterpretSingleOption
                            ((OptionInterpreter *)&existing_proto,(Message *)this_00);
          iVar26 = iVar26 + 1;
        } while (bVar6);
        existing_proto._unknown_fields_.fields_ =
             (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              *)0x0;
        existing_proto.name_ = (string *)0x0;
        paVar19 = extraout_RDX_00;
        pOVar23 = local_138;
LAB_001e21da:
      }
      __first = (this->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pOVar23 != __first) {
        std::
        _Destroy<google::protobuf::(anonymous_namespace)::OptionsToInterpret*,google::protobuf::(anonymous_namespace)::OptionsToInterpret>
                  (__first,__last,paVar19);
        (this->options_to_interpret_).
        super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
        ._M_impl.super__Vector_impl_data._M_finish = __first;
      }
      DynamicMessageFactory::~DynamicMessageFactory
                ((DynamicMessageFactory *)&existing_proto.package_);
      bVar7 = this->had_errors_;
    }
    if ((bVar7 & 1) == 0) {
      ValidateFileOptions(this,local_1a0,proto);
      bVar7 = this->had_errors_;
    }
    if ((bVar7 & 1) == 0) {
      DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
    }
    else {
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
      local_1a0 = (FileDescriptor *)0x0;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&seen_dependencies._M_t);
  }
  else {
    psVar13 = proto->name_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&existing_proto,"A file with this name is already in the pool.",
               (allocator<char> *)&local_170);
    AddError(this,psVar13,&proto->super_Message,OTHER,(string *)&existing_proto);
    std::__cxx11::string::~string((string *)&existing_proto);
    DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
LAB_001e1b93:
    local_1a0 = (FileDescriptor *)0x0;
  }
  return local_1a0;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accomodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != NULL) {
    // File already in pool.  Compare the existing one to the input.
    FileDescriptorProto existing_proto;
    existing_file->CopyTo(&existing_proto);
    if (existing_proto.SerializeAsString() == proto.SerializeAsString()) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      string error_message("File recursively imports itself: ");
      for (; i < tables_->pending_files_.size(); i++) {
        error_message.append(tables_->pending_files_[i]);
        error_message.append(" -> ");
      }
      error_message.append(proto.name());

      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               error_message);
      return NULL;
    }
  }

  // If we have a fallback_database_, attempt to load all dependencies now,
  // before checkpointing tables_.  This avoids confusion with recursive
  // checkpoints.
  if (pool_->fallback_database_ != NULL) {
    tables_->pending_files_.push_back(proto.name());
    for (int i = 0; i < proto.dependency_size(); i++) {
      if (tables_->FindFile(proto.dependency(i)) == NULL &&
          (pool_->underlay_ == NULL ||
           pool_->underlay_->FindFileByName(proto.dependency(i)) == NULL)) {
        // We don't care what this returns since we'll find out below anyway.
        pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
      }
    }
    tables_->pending_files_.pop_back();
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  if (proto.has_source_code_info()) {
    SourceCodeInfo *info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    tables_->RollbackToLastCheckpoint();
    return NULL;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  set<string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
    tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Import \"" + proto.dependency(i) + "\" was listed twice.");
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == NULL && pool_->underlay_ != NULL) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == NULL) {
      if (pool_->allow_unknown_) {
        dependency = NewPlaceholderFile(proto.dependency(i));
      } else {
        string message;
        if (pool_->fallback_database_ == NULL) {
          message = "Import \"" + proto.dependency(i) +
                    "\" has not been loaded.";
        } else {
          message = "Import \"" + proto.dependency(i) +
                    "\" was not found or had errors.";
        }
        AddError(proto.name(), proto,
                 DescriptorPool::ErrorCollector::OTHER,
                 message);
      }
    }

    result->dependencies_[i] = dependency;
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ = tables_->AllocateArray<int>(
      proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  for (int i = 0; i < result->dependency_count(); i++) {
    RecordPublicDependencies(result->dependency(i));
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ = tables_->AllocateArray<int>(
      proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage  , NULL);
  BUILD_ARRAY(proto, result, enum_type   , BuildEnum     , NULL);
  BUILD_ARRAY(proto, result, service     , BuildService  , NULL);
  BUILD_ARRAY(proto, result, extension   , BuildExtension, NULL);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
  }

  // Validate options.
  if (!had_errors_) {
    ValidateFileOptions(result, proto);
  }

  if (had_errors_) {
    tables_->RollbackToLastCheckpoint();
    return NULL;
  } else {
    tables_->ClearLastCheckpoint();
    return result;
  }
}